

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

void bcm2835_gpio_write_mask(uint32_t value,uint32_t mask)

{
  if (debug == '\0') {
    bcm2835_gpio[7] = mask & value;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n");
  }
  if (debug != '\0') {
    printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_gpio + 10,(ulong)(~value & mask));
    return;
  }
  bcm2835_gpio[10] = ~value & mask;
  return;
}

Assistant:

void bcm2835_gpio_write_mask(uint32_t value, uint32_t mask)
{
    bcm2835_gpio_set_multi(value & mask);
    bcm2835_gpio_clr_multi((~value) & mask);
}